

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeprom.c
# Opt level: O1

void write_half_eeprom(int active_dma,gbabus_t *bus,gbamem_t *mem,uint32_t address,uint16_t value)

{
  int iVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  size_t *__s;
  int iVar5;
  uint uVar6;
  uint extraout_EDX;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 in_register_0000003c;
  long lVar10;
  byte bVar11;
  uint uVar12;
  size_t sVar13;
  
  __s = (size_t *)CONCAT44(in_register_0000003c,active_dma);
  if (mem->eeprom_initialized != false) goto LAB_001217cc;
  switch(active_dma) {
  case 0:
    uVar4 = (uint)(bus->DMA0CNT_L).raw;
    break;
  case 1:
    uVar4 = (uint)(bus->DMA1CNT_L).raw;
    break;
  case 2:
    uVar4 = (uint)(bus->DMA2CNT_L).raw;
    break;
  case 3:
    bus = (gbabus_t *)(ulong)(bus->DMA3CNT_L).raw;
  default:
    goto switchD_00121742_default;
  }
  bus = (gbabus_t *)(ulong)(uVar4 & 0x3fff);
switchD_00121742_default:
  if ((int)bus == 0x11) {
    sVar13 = 0x2000;
    __s = (size_t *)malloc(0x2000);
    mem->backup = (uint8_t *)__s;
    __n = 0x2000;
LAB_001217aa:
    bus = (gbabus_t *)0xff;
    memset(__s,0xff,__n);
    mem->backup_size = sVar13;
    mem->eeprom_initialized = true;
    read_persisted_backup();
LAB_001217cc:
    if (EEPROM_ACCEPT_WRITE_ADDRESS < mem->eeprom_state) goto switchD_001217ea_caseD_2;
    switch(mem->eeprom_state) {
    case EEPROM_READY:
      mem->eeprom_command = (byte)value * '\x02' & 2;
      mem->eeprom_state = EEPROM_CMD_1;
      break;
    case EEPROM_CMD_1:
      bVar11 = (byte)value & 1 | mem->eeprom_command;
      mem->eeprom_command = bVar11;
      handle_eeprom_command(mem,bVar11);
      return;
    default:
      goto switchD_001217ea_caseD_2;
    case EEPROM_WRITE:
      iVar1 = mem->eeprom_bits_remaining;
      if (0 < iVar1) {
        uVar6 = 0x40 - iVar1;
        uVar4 = 0x47 - iVar1;
        if (-1 < (int)uVar6) {
          uVar4 = uVar6;
        }
        uVar6 = ((uVar4 & 0xfffffff8) - uVar6) + 7;
        uVar4 = (int)uVar4 >> 3;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Transferring %d/64 data bits (byte offset 0x%02X from base address, bit %d)\n\x1b[0;m"
                 ,(ulong)(0x41 - iVar1),(ulong)uVar4,(ulong)uVar6);
        }
        uVar12 = value & 1;
        uVar7 = (long)(int)uVar4 + (ulong)mem->eeprom_address;
        bus = (gbabus_t *)(uVar7 & 0xffffffff);
        if (bus <= (gbabus_t *)mem->backup_size) {
          bVar11 = mem->backup[uVar7];
          bVar2 = (byte)(uVar12 << ((byte)uVar6 & 0x1f)) |
                  ~(byte)(1 << ((byte)uVar6 & 0x1f)) & bVar11;
          mem->backup[(long)bus] = bVar2;
          mem->backup_dirty = true;
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Wrote bit %d to bit number %d in byte offset: %d. Old value: 0x%02X New value: 0x%02X\n\x1b[0;m"
                   ,(ulong)uVar12,(ulong)uVar6,(ulong)uVar4,(ulong)bVar11,(ulong)bVar2);
          }
LAB_001219ed:
          mem->eeprom_bits_remaining = mem->eeprom_bits_remaining + -1;
          return;
        }
        goto LAB_00121a87;
      }
      if (iVar1 == 0) {
        __s = (size_t *)(ulong)value;
        if ((value & 1) == 0) {
          mem->eeprom_bits_remaining = 10;
          mem->eeprom_state = EEPROM_POST_WRITE;
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  EEPROM write stream completed.\n\x1b[0;m");
          }
          goto LAB_001219ed;
        }
        goto LAB_00121a9b;
      }
      goto LAB_00121a96;
    case EEPROM_ACCEPT_READ_ADDRESS:
      if (mem->eeprom_bits_remaining < 1) {
        if (((value & 1) != 0) && (gba_log_verbosity != 0)) {
          printf("\x1b[0;33m[WARN]  Expected a value with an LSB of 0 here, got %d (0x%04X)\n\x1b[0;m"
                 ,1);
        }
        uVar3 = mem->eeprom_address << 3;
        mem->eeprom_address = uVar3;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Reading 64 bits from EEPROM starting at address: 0x%04X\n\x1b[0;m"
                 ,(ulong)uVar3);
        }
        mem->eeprom_state = EEPROM_READ;
        mem->eeprom_bits_remaining = 0x44;
      }
      else {
        mem->eeprom_address = (value & 1) + mem->eeprom_address * 2;
        mem->eeprom_bits_remaining = mem->eeprom_bits_remaining + -1;
      }
      break;
    case EEPROM_ACCEPT_WRITE_ADDRESS:
      if (0 < mem->eeprom_bits_remaining) {
        iVar1 = (value & 1) + (uint)mem->eeprom_address * 2;
        mem->eeprom_address = (uint16_t)iVar1;
        iVar5 = mem->eeprom_bits_remaining + -1;
        mem->eeprom_bits_remaining = iVar5;
        if (iVar5 != 0) {
          return;
        }
        uVar4 = iVar1 * 8;
        mem->eeprom_address = (uint16_t)uVar4;
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Writing 64 bits to EEPROM starting at address: 0x%04X\n\x1b[0;m"
                 ,(ulong)(uVar4 & 0xffff));
        }
        mem->eeprom_state = EEPROM_WRITE;
        mem->eeprom_bits_remaining = 0x40;
        return;
      }
      goto LAB_00121a6e;
    }
    return;
  }
  if ((int)bus == 9) {
    sVar13 = 0x200;
    __s = (size_t *)malloc(0x200);
    mem->backup = (uint8_t *)__s;
    __n = 0x200;
    goto LAB_001217aa;
  }
  write_half_eeprom_cold_1();
LAB_00121a6e:
  write_half_eeprom_cold_5();
switchD_001217ea_caseD_2:
  mem = (gbamem_t *)&mem->eeprom_state;
  bus = (gbabus_t *)mem;
  write_half_eeprom_cold_6();
LAB_00121a87:
  __s = &mem->backup_size;
  write_half_eeprom_cold_4();
LAB_00121a96:
  write_half_eeprom_cold_2();
LAB_00121a9b:
  write_half_eeprom_cold_3();
  if (3 < extraout_EDX) {
    uVar7 = __s[0x80f];
    lVar10 = 0;
    uVar8 = __s[0x80e];
    do {
      uVar9 = uVar8;
      if (uVar8 < uVar7) {
        uVar9 = uVar8 + 1;
        __s[0x80e] = uVar9;
        *(undefined4 *)((long)__s + 0x408c) =
             *(undefined4 *)((long)__s + (ulong)((uint)uVar8 & 0xfff) * 4 + 0x70);
      }
      *(undefined4 *)(&bus->interrupt_master_enable + lVar10 * 2) =
           *(undefined4 *)((long)__s + 0x408c);
      lVar10 = lVar10 + 1;
      uVar8 = uVar9;
    } while (((ulong)(long)(int)extraout_EDX >> 2) +
             (ulong)((ulong)(long)(int)extraout_EDX >> 2 == 0) != lVar10);
  }
  return;
}

Assistant:

void write_half_eeprom(int active_dma, gbabus_t* bus, gbamem_t* mem, word address, half value) {
    if (!mem->eeprom_initialized) {
        int wc;
        switch (active_dma) {
            case 0:
                wc = bus->DMA0CNT_L.wc;
                break;
            case 1:
                wc = bus->DMA1CNT_L.wc;
                break;
            case 2:
                wc = bus->DMA2CNT_L.wc;
                break;
            case 3:
                wc = bus->DMA3CNT_L.wc;
                break;
        }

        switch (wc) {
            case 9: // 9 bits = 2 for command, 6 for address, 1 to end command
                if (!mem->eeprom_initialized) {
                    init_eeprom(mem, EEPROM_512);
                }
                break;
            case 17: // 17 bits = 2 for command, 14 for address, 1 to end command
                if (!mem->eeprom_initialized) {
                    init_eeprom(mem, EEPROM_8K);
                }
                break;
            default:
                logfatal("Write to EEPROM with active DMA %d and a WC of %d", active_dma, wc)
        }
    }

    switch (mem->eeprom_state) {
        case EEPROM_READY:
            mem->eeprom_command = (value & 1) << 1;
            mem->eeprom_state = EEPROM_CMD_1;
            break;
        case EEPROM_CMD_1:
            mem->eeprom_command |= (value & 1);
            handle_eeprom_command(mem, mem->eeprom_command);
            break;
        case EEPROM_ACCEPT_READ_ADDRESS:
            if (mem->eeprom_bits_remaining > 0) {
                mem->eeprom_address <<= 1;
                mem->eeprom_address |= (value & 1);
                mem->eeprom_bits_remaining--;
            } else {
                if ((value & 1) != 0) {
                    logwarn("Expected a value with an LSB of 0 here, got %d (0x%04X)", value & 1, value)
                }
                mem->eeprom_address <<= 3; // Addresses are in 8 bit blocks
                logwarn("Reading 64 bits from EEPROM starting at address: 0x%04X", mem->eeprom_address)
                mem->eeprom_state = EEPROM_READ;
                mem->eeprom_bits_remaining = 64 + 4; // Plus 4 garbage bits
            }
            break;
        case EEPROM_ACCEPT_WRITE_ADDRESS:
            if (mem->eeprom_bits_remaining > 0) {
                mem->eeprom_address <<= 1;
                mem->eeprom_address |= (value & 1);
                if (--mem->eeprom_bits_remaining == 0) {
                    mem->eeprom_address <<= 3; // Addresses are in 8-byte blocks
                    logwarn("Writing 64 bits to EEPROM starting at address: 0x%04X", mem->eeprom_address)
                    mem->eeprom_state = EEPROM_WRITE;
                    mem->eeprom_bits_remaining = 64;
                }
            } else {
                logfatal("Trying to accept a write address when one is unexpected!")
            }
            break;
        case EEPROM_WRITE: {
            int bit = 64 - mem->eeprom_bits_remaining;
            if (mem->eeprom_bits_remaining > 0) {
                int byte_offset = bit / 8;
                int bit_in_byte = 7 - (bit % 8); // MSB first
                byte mask = ~(1 << bit_in_byte);
                logwarn("Transferring %d/64 data bits (byte offset 0x%02X from base address, bit %d)", bit + 1,
                        byte_offset, bit_in_byte)
                byte eeprom_value = mem->backup[mem->eeprom_address + byte_offset];
                byte old_value = eeprom_value;
                eeprom_value &= mask;
                eeprom_value |= ((value & 1) << bit_in_byte);
                word index = mem->eeprom_address + byte_offset;
                if (index > mem->backup_size) {
                    logfatal("Access to EEPROM outside backup space! Index: %d Backup size: %zu", index, mem->backup_size)
                }
                mem->backup[index] = eeprom_value;
                mem->backup_dirty = true;
                logwarn("Wrote bit %d to bit number %d in byte offset: %d. Old value: 0x%02X New value: 0x%02X",
                        value & 1, bit_in_byte, byte_offset, old_value, eeprom_value);
            } else if (mem->eeprom_bits_remaining == 0) {
                if ((value & 1) != 0) {
                    logfatal("Expected a write with an LSB of 0 after an EEPROM write stream, instead, got: 0x%04X",
                             value)
                }
                mem->eeprom_bits_remaining = EEPROM_READS_UNTIL_READY;
                mem->eeprom_state = EEPROM_POST_WRITE; // Entire stream has been written
                logwarn("EEPROM write stream completed.")
            } else {
                logfatal("Tried to read from EEPROM when no data was remaining")
            }
            mem->eeprom_bits_remaining--;
            break;
        }
        default:
            logfatal("Write half 0x%04X to EEPROM in unknown state: %d at addr 0x%08X", value, mem->eeprom_state, address)
    }
}